

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void coins_tests::CheckWriteCoins
               (CAmount parent_value,CAmount child_value,CAmount expected_value,char parent_flags,
               char child_flags,char expected_flags)

{
  long lVar1;
  undefined7 in_register_00000081;
  iterator pvVar2;
  undefined7 in_register_00000089;
  iterator pvVar3;
  CAmount *pCVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined **local_430;
  undefined1 local_428;
  undefined1 *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char result_flags;
  CAmount result_value;
  char expected_flags_local;
  CAmount expected_value_local;
  SingleEntryCacheTest test;
  
  pvVar3 = (iterator)CONCAT71(in_register_00000089,expected_flags);
  pvVar2 = (iterator)CONCAT71(in_register_00000081,child_flags);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  expected_flags_local = expected_flags;
  expected_value_local = expected_value;
  SingleEntryCacheTest::SingleEntryCacheTest(&test,-2,parent_value,parent_flags);
  WriteCoinsViewEntry((CCoinsView *)&test.cache,child_value,child_flags);
  anon_unknown.dwarf_4a5d0d::CCoinsViewCacheTest::SelfTest(&test.cache,false);
  GetCoinsMapEntry(&test.cache.super_CCoinsViewCache.cacheCoins,&result_value,&result_flags,
                   (COutPoint *)OUTPOINT);
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar3;
  msg.m_begin = pvVar2;
  file.m_end = (iterator)0x33d;
  file.m_begin = (iterator)&local_400;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_410,msg);
  local_428 = 0;
  local_430 = &PTR__lazy_ostream_01139f30;
  local_420 = boost::unit_test::lazy_ostream::inst;
  local_418 = "";
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_438 = "";
  pvVar2 = (iterator)0x2;
  pCVar4 = &result_value;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_430,&local_440,0x33d,1,2,pCVar4,"result_value",&expected_value_local,
             "expected_value");
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pCVar4;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x33e;
  file_00.m_begin = (iterator)&local_450;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_460,
             msg_00);
  local_428 = 0;
  local_430 = &PTR__lazy_ostream_01139f30;
  local_420 = boost::unit_test::lazy_ostream::inst;
  local_418 = "";
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_468 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (&local_430,&local_470,0x33e,1,2,&result_flags,"result_flags",&expected_flags_local,
             "expected_flags");
  SingleEntryCacheTest::~SingleEntryCacheTest(&test);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckWriteCoins(CAmount parent_value, CAmount child_value, CAmount expected_value, char parent_flags, char child_flags, char expected_flags)
{
    SingleEntryCacheTest test(ABSENT, parent_value, parent_flags);

    CAmount result_value;
    char result_flags;
    try {
        WriteCoinsViewEntry(test.cache, child_value, child_flags);
        test.cache.SelfTest(/*sanity_check=*/false);
        GetCoinsMapEntry(test.cache.map(), result_value, result_flags);
    } catch (std::logic_error&) {
        result_value = FAIL;
        result_flags = NO_ENTRY;
    }

    BOOST_CHECK_EQUAL(result_value, expected_value);
    BOOST_CHECK_EQUAL(result_flags, expected_flags);
}